

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O1

unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> __thiscall
duckdb::Binder::BindPivot
          (Binder *this,PivotRef *ref,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *all_columns)

{
  pointer puVar1;
  ClientContext *pCVar2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar3;
  SampleOptions *pSVar4;
  pointer pcVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  _func_int **pp_Var8;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var9;
  size_type sVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  TableRef *pTVar12;
  BaseExpression *pBVar13;
  undefined8 uVar14;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var15;
  pointer prVar16;
  char cVar17;
  bool bVar18;
  int iVar19;
  pointer pPVar20;
  type pPVar21;
  idx_t iVar22;
  reference pvVar23;
  iterator iVar24;
  ClientConfig *pCVar25;
  pointer pSVar26;
  undefined8 *puVar27;
  pointer pSVar28;
  ConstantExpression *pCVar29;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var30;
  SelectNode *pSVar31;
  pointer pSVar32;
  reference pvVar33;
  ColumnRefExpression *this_00;
  pointer pCVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  pointer pFVar36;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var37;
  pointer pPVar38;
  StarExpression *this_01;
  CastExpression *pCVar39;
  reference pvVar40;
  FunctionExpression *pFVar41;
  BinderException *pBVar42;
  long *plVar43;
  PivotRef *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  PivotRef *pPVar45;
  ulong uVar46;
  long *plVar47;
  Value *val;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *pivot_name;
  pointer puVar48;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar49
  ;
  size_type sVar50;
  size_type __n;
  char cVar51;
  ulong uVar52;
  long lVar53;
  uint64_t value;
  PivotRef *this_02;
  reference_wrapper<duckdb::FunctionExpression> *aggr;
  pointer prVar54;
  _func_int **pp_Var55;
  long lVar56;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> __x;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr_1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  templated_unique_single_t aggregate;
  string enum_value;
  value_set_t pivots;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> subquery_stage1;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> subquery_stage2;
  string pivot_alias;
  string error_str;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *pivot_node;
  templated_unique_single_t subquery_select;
  vector<duckdb::PivotValueElement,_true> pivot_values;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> pivot_aggregates;
  case_insensitive_set_t handled_columns;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_370;
  PivotRef *local_368;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_360;
  undefined1 local_358 [72];
  PivotRef *local_310;
  PivotRef *local_308;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined4 local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_2a8;
  PivotRef *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  Val local_278;
  undefined1 local_268 [8];
  pointer pbStack_260;
  _Alloc_hider local_258;
  _Alloc_hider _Stack_250;
  Val local_248;
  optional_idx local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_230;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_210;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_208;
  __node_base local_1f0;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_1e8;
  PivotRef *local_1c8;
  PivotRef *local_1c0;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> local_1b8;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_198;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_178;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_158;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_138;
  ClientContext *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  string local_a0;
  string local_80;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_60 [24];
  LogicalType local_48;
  
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar48 = all_columns[4].
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar1 = all_columns[5].
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_310 = (PivotRef *)all_columns;
  local_2a0 = ref;
  local_210._M_head_impl = (SelectNode *)this;
  if (puVar48 != puVar1) {
    do {
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar48);
      iVar19 = (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[4])(pPVar20);
      if ((char)iVar19 != '\0') {
        pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar48);
        local_278.bigint = (int64_t)local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"Pivot expression cannot contain subqueries","");
        BinderException::BinderException<>(pBVar42,pPVar21,(string *)&local_278.hugeint);
        __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar48);
      iVar19 = (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[3])(pPVar20);
      if ((char)iVar19 != '\0') {
        pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar48);
        local_278.bigint = (int64_t)local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"Pivot expression cannot contain window functions","");
        BinderException::BinderException<>(pBVar42,pPVar21,(string *)&local_278.hugeint);
        __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar53 = (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (ClientContext *)(local_2a0->super_TableRef).alias._M_dataplus._M_p;
      pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar48);
      ExtractPivotAggregateExpression(pCVar2,pPVar21,&local_1b8);
      lVar53 = lVar53 >> 3;
      lVar56 = (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (lVar56 != lVar53 + 1) {
        if (lVar56 - lVar53 == 0) {
          local_278.bigint = (int64_t)local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"but no aggregates were found","");
        }
        else {
          ::std::__cxx11::to_string((string *)&local_2f8,lVar56 - lVar53);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,"but ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2f8);
          plVar43 = (long *)::std::__cxx11::string::append(local_358);
          local_278.bigint = *plVar43;
          plVar47 = plVar43 + 2;
          if (local_278._0_8_ == plVar47) {
            local_268 = (undefined1  [8])*plVar47;
            pbStack_260 = (pointer)plVar43[3];
            local_278.bigint = (int64_t)local_268;
          }
          else {
            local_268 = (undefined1  [8])*plVar47;
          }
          local_278.hugeint.upper = plVar43[1];
          *plVar43 = (long)plVar47;
          plVar43[1] = 0;
          *(undefined1 *)(plVar43 + 2) = 0;
        }
        if (lVar56 != lVar53) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_358 + 0x10)) {
            operator_delete((void *)local_358._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity);
          }
        }
        pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar48);
        local_298._M_allocated_capacity = (size_type)&local_288;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"Pivot expression must contain exactly one aggregate, %s",""
                  );
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_278.bigint,
                   (undefined1 *)(local_278.hugeint.upper + local_278.bigint));
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar42,pPVar21,(string *)&local_298,&local_f8);
        __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      puVar48 = puVar48 + 1;
    } while (puVar48 != puVar1);
  }
  prVar16 = local_1b8.
            super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1b8.
      super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1b8.
      super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar54 = local_1b8.
              super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      ExtractPivotExpressions
                (&prVar54->_M_data->super_ParsedExpression,(case_insensitive_set_t *)&local_d8);
      prVar54 = prVar54 + 1;
    } while (prVar54 != prVar16);
  }
  pPVar45 = (PivotRef *)
            (local_310->pivots).
            super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
            super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1c0 = (PivotRef *)
              (local_310->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1c8 = in_RCX;
  if (pPVar45 == local_1c0) {
    local_308 = (PivotRef *)&DAT_00000001;
  }
  else {
    local_308 = (PivotRef *)&DAT_00000001;
    do {
      local_368 = pPVar45;
      if ((pPVar45->super_TableRef).column_name_alias.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pCVar2 = (ClientContext *)(local_2a0->super_TableRef).alias._M_dataplus._M_p;
        local_278.bigint = (int64_t)local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,anon_var_dwarf_4f001a4 + 9,anon_var_dwarf_4f001a4 + 9);
        local_358._0_8_ = local_358 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,anon_var_dwarf_4f001a4 + 9,anon_var_dwarf_4f001a4 + 9);
        local_2f8._M_allocated_capacity =
             (size_type)
             Catalog::GetEntry<duckdb::TypeCatalogEntry>
                       (pCVar2,(string *)&local_278.hugeint,(string *)local_358,
                        (string *)
                        &(local_368->super_TableRef).external_dependency.internal.
                         super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
        optional_ptr<duckdb::TypeCatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::TypeCatalogEntry,_true> *)&local_2f8._M_allocated_capacity)
        ;
        uVar14 = local_2f8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_358 + 0x10)) {
          operator_delete((void *)local_358._0_8_);
        }
        if (local_278._0_8_ != local_268) {
          operator_delete((void *)local_278.bigint);
        }
        LogicalType::LogicalType((LogicalType *)&local_2f8,(LogicalType *)(uVar14 + 0x120));
        if (local_2f8._M_local_buf[0] != 'h') {
          pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
          local_278.bigint = (int64_t)local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,
                     "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"","");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          p_Var11 = (local_368->super_TableRef).external_dependency.internal.
                    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,p_Var11,
                     (long)&p_Var11->_vptr__Sp_counted_base +
                     (long)(local_368->super_TableRef).column_name_alias.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          LogicalType::ToString_abi_cxx11_(&local_80,(LogicalType *)&local_2f8);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar42,&local_310->super_TableRef,(string *)&local_278.hugeint,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80)
          ;
          __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar18 = LogicalType::IsComplete((LogicalType *)&local_2f8);
        if (!bVar18) {
          pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
          local_278.bigint = (int64_t)local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"ENUM type is incomplete","");
          BinderException::BinderException(pBVar42,(string *)&local_278.hugeint);
          __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar22 = EnumType::GetSize((LogicalType *)&local_2f8);
        if (iVar22 != 0) {
          pTVar12 = &local_368->super_TableRef;
          value = 0;
          do {
            Value::ENUM((Value *)&local_278.hugeint,value,(LogicalType *)&local_2f8);
            EnumType::GetValue_abi_cxx11_((string *)local_358,(EnumType *)&local_278.hugeint,val);
            Value::~Value((Value *)&local_278.hugeint);
            local_268 = (undefined1  [8])0x0;
            pbStack_260 = (pointer)0x0;
            local_278.bigint = 0;
            local_278.hugeint.upper = 0;
            local_258._M_p = (pointer)&local_248;
            _Stack_250._M_p = (pointer)0x0;
            local_248.ubigint = local_248.ubigint & 0xffffffffffffff00;
            ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_278.hugeint,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358);
            ::std::__cxx11::string::operator=((string *)&local_258,(string *)local_358);
            ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
            emplace_back<duckdb::PivotColumnEntry>
                      ((vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                        *)&pTVar12->sample,(PivotColumnEntry *)&local_278.hugeint);
            if ((Val *)local_258._M_p != &local_248) {
              operator_delete(local_258._M_p);
            }
            if (pbStack_260 != (pointer)0x0) {
              (**(code **)(*(long *)pbStack_260 + 8))();
            }
            pbStack_260 = (pointer)0x0;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278.hugeint);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_);
            }
            value = value + 1;
          } while (iVar22 != value);
        }
        LogicalType::~LogicalType((LogicalType *)&local_2f8);
      }
      local_2b8._8_8_ =
           (local_368->super_TableRef).query_location.index -
           (long)(local_368->super_TableRef).sample.
                 super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                 .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
      puVar3 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 **)&(local_368->super_TableRef).type;
      for (puVar49 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)(local_368->super_TableRef)._vptr_TableRef; puVar49 != puVar3;
          puVar49 = puVar49 + 1) {
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar49);
        ExtractPivotExpressions(pPVar21,(case_insensitive_set_t *)&local_d8);
      }
      local_2f8._M_allocated_capacity = (size_type)&aStack_2c8;
      local_2f8._8_8_ = &DAT_00000001;
      local_2e8._M_allocated_capacity = 0;
      local_2e8._8_8_ = 0;
      local_2d8 = 0x3f800000;
      local_2d0 = 0;
      aStack_2c8._M_allocated_capacity = 0;
      pSVar4 = (SampleOptions *)(local_368->super_TableRef).query_location.index;
      for (__x._M_head_impl =
                (local_368->super_TableRef).sample.
                super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
          __x._M_head_impl != pSVar4;
          __x._M_head_impl = (SampleOptions *)&(__x._M_head_impl)->is_percentage) {
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value((Value *)&local_278.hugeint,&local_48);
        LogicalType::~LogicalType(&local_48);
        if (*(long *)&((__x._M_head_impl)->sample_size).type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> -
            *(long *)&((__x._M_head_impl)->sample_size).type_ == 0x40) {
          pvVar23 = vector<duckdb::Value,_true>::operator[]
                              ((vector<duckdb::Value,_true> *)__x._M_head_impl,0);
          Value::operator=((Value *)&local_278.hugeint,pvVar23);
        }
        else {
          LogicalType::LogicalType((LogicalType *)&local_298,VARCHAR);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                    (local_60,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                              __x._M_head_impl);
          Value::LIST((Value *)local_358,(LogicalType *)&local_298,
                      (vector<duckdb::Value,_true> *)local_60);
          Value::operator=((Value *)&local_278.hugeint,(Value *)local_358);
          Value::~Value((Value *)local_358);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_60);
          LogicalType::~LogicalType((LogicalType *)&local_298);
        }
        iVar24 = ::std::
                 _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&local_2f8,(key_type *)&local_278.hugeint);
        if (iVar24.super__Node_iterator_base<duckdb::Value,_true>._M_cur != (__node_type *)0x0) {
          pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
          local_358._0_8_ = local_358 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,
                     "The value \"%s\" was specified multiple times in the IN clause","");
          Value::ToString_abi_cxx11_(&local_a0,(Value *)&local_278.hugeint);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar42,&local_310->super_TableRef,(string *)local_358,&local_a0);
          __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (*(long *)&((__x._M_head_impl)->sample_size).type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> -
            *(long *)&((__x._M_head_impl)->sample_size).type_ >> 6 !=
            *(long *)&(local_368->super_TableRef).type -
            (long)(local_368->super_TableRef)._vptr_TableRef >> 3) {
          pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
          local_358._0_8_ = local_358 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,
                     "PIVOT IN list - inconsistent amount of rows - expected %d but got %d","");
          BinderException::BinderException<unsigned_long,unsigned_long>
                    (pBVar42,&local_310->super_TableRef,(string *)local_358,
                     *(long *)&(local_368->super_TableRef).type -
                     (long)(local_368->super_TableRef)._vptr_TableRef >> 3,
                     *(long *)&((__x._M_head_impl)->sample_size).type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                     - *(long *)&((__x._M_head_impl)->sample_size).type_ >> 6);
          __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_358._0_8_ = &local_2f8;
        ::std::
        _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                  ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_358._0_8_,&local_278,local_358);
        Value::~Value((Value *)&local_278.hugeint);
      }
      local_308 = (PivotRef *)((long)local_308 * ((long)local_2b8._8_8_ >> 6));
      ::std::
      _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_2f8);
      pPVar45 = (PivotRef *)&local_368->aggregates;
    } while (pPVar45 != local_1c0);
  }
  pCVar25 = ClientConfig::GetConfig
                      ((ClientContext *)(local_2a0->super_TableRef).alias._M_dataplus._M_p);
  pPVar45 = local_1c8;
  if ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
      pCVar25->pivot_limit <= local_308) {
    pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
    local_278.bigint = (int64_t)local_268;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
               "");
    BinderException::BinderException<unsigned_long>
              (pBVar42,&local_310->super_TableRef,(string *)&local_278.hugeint,pCVar25->pivot_limit)
    ;
    __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1e8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = (undefined1  [8])0x0;
  local_248.bigint = 0;
  local_278.bigint = 0;
  local_278.hugeint.upper = 0;
  local_258._M_p = (pointer)0x0;
  _Stack_250._M_p = (pointer)0x0;
  pbStack_260 = (pointer)&_Stack_250;
  ConstructPivots(local_310,(vector<duckdb::PivotValueElement,_true> *)&local_1e8,0,
                  (PivotValueElement *)&local_278.hugeint);
  if (pbStack_260 != (pointer)&_Stack_250) {
    operator_delete(pbStack_260);
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278.hugeint);
  ((local_210._M_head_impl)->super_QueryNode)._vptr_QueryNode = (_func_int **)0x0;
  uVar52 = ((long)local_1e8.
                  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1e8.
                  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (uVar52 < pCVar25->pivot_filter_threshold || uVar52 - pCVar25->pivot_filter_threshold == 0) {
    pCVar2 = (ClientContext *)(local_2a0->super_TableRef).alias._M_dataplus._M_p;
    local_298._M_allocated_capacity = (size_type)(pPVar45->super_TableRef)._vptr_TableRef;
    local_298._8_8_ = *(undefined8 *)&(pPVar45->super_TableRef).type;
    local_288._M_allocated_capacity = (size_type)(pPVar45->super_TableRef).alias._M_dataplus._M_p;
    (pPVar45->super_TableRef).alias._M_dataplus._M_p = (pointer)0x0;
    (pPVar45->super_TableRef)._vptr_TableRef = (_func_int **)0x0;
    *(undefined8 *)&(pPVar45->super_TableRef).type = 0;
    local_138.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_138.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_138.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)&local_300,local_310,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_298,(case_insensitive_set_t *)&local_d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_298);
    local_308 = (PivotRef *)
                local_138.
                super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1c8 = (PivotRef *)
                local_138.
                super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_120 = pCVar2;
      do {
        local_370._M_head_impl = (ParsedExpression *)0x0;
        pPVar45 = (PivotRef *)
                  (local_310->pivots).
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_1c0 = (PivotRef *)
                    (local_310->pivots).
                    super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (pPVar45 != local_1c0) {
          __n = 0;
          do {
            this_02 = (PivotRef *)(pPVar45->super_TableRef)._vptr_TableRef;
            local_2b8._8_8_ = *(undefined8 *)&(pPVar45->super_TableRef).type;
            local_2a0 = pPVar45;
            if (this_02 != (PivotRef *)local_2b8._8_8_) {
              do {
                pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                        *)this_02);
                (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_2f8,pPVar20);
                pCVar39 = (CastExpression *)operator_new(0x60);
                LogicalType::LogicalType((LogicalType *)&local_278.hugeint,VARCHAR);
                local_358._0_8_ = local_2f8._M_allocated_capacity;
                local_2f8._M_allocated_capacity = 0;
                CastExpression::CastExpression
                          (pCVar39,(LogicalType *)&local_278.hugeint,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_358,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_358._0_8_ + 8))();
                }
                local_358._0_8_ = (pointer)0x0;
                LogicalType::~LogicalType((LogicalType *)&local_278.hugeint);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*local_2f8._M_allocated_capacity + 8))();
                }
                pvVar23 = vector<duckdb::Value,_true>::operator[]
                                    ((vector<duckdb::Value,_true> *)local_308,__n);
                LogicalType::LogicalType((LogicalType *)&local_2f8,VARCHAR);
                Value::DefaultCastAs((Value *)local_358,pvVar23,(LogicalType *)&local_2f8,false);
                pCVar29 = (ConstantExpression *)operator_new(0x78);
                local_368 = this_02;
                Value::Value((Value *)&local_278.hugeint,(Value *)local_358);
                ConstantExpression::ConstantExpression(pCVar29,(Value *)&local_278.hugeint);
                Value::~Value((Value *)&local_278.hugeint);
                Value::~Value((Value *)local_358);
                LogicalType::~LogicalType((LogicalType *)&local_2f8);
                _Var30._M_head_impl = (ParsedExpression *)operator_new(0x48);
                local_358._0_8_ = pCVar29;
                local_278.bigint = (int64_t)pCVar39;
                ComparisonExpression::ComparisonExpression
                          ((ComparisonExpression *)_Var30._M_head_impl,COMPARE_BOUNDARY_END,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&local_278.hugeint,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_358);
                if ((ConstantExpression *)local_358._0_8_ != (ConstantExpression *)0x0) {
                  (**(code **)(*(long *)local_358._0_8_ + 8))();
                }
                local_358._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                if (local_278._0_8_ != (CastExpression *)0x0) {
                  (**(code **)(*(long *)local_278.bigint + 8))();
                }
                pPVar45 = local_368;
                if ((CastExpression *)local_370._M_head_impl != (CastExpression *)0x0) {
                  pCVar39 = (CastExpression *)operator_new(0x50);
                  local_278.bigint = (int64_t)local_370._M_head_impl;
                  local_370._M_head_impl = (ParsedExpression *)0x0;
                  local_358._0_8_ = _Var30._M_head_impl;
                  ConjunctionExpression::ConjunctionExpression
                            ((ConjunctionExpression *)pCVar39,CONJUNCTION_AND,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&local_278.hugeint,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_358);
                  if ((CastExpression *)local_358._0_8_ != (CastExpression *)0x0) {
                    (**(code **)(*(long *)local_358._0_8_ + 8))();
                  }
                  local_358._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  if (local_278._0_8_ != (CastExpression *)0x0) {
                    (**(code **)(*(long *)local_278.bigint + 8))();
                  }
                  _Var30._M_head_impl = (ParsedExpression *)pCVar39;
                  if (local_370._M_head_impl != (ParsedExpression *)0x0) {
                    pBVar13 = &(local_370._M_head_impl)->super_BaseExpression;
                    local_370._M_head_impl = (ParsedExpression *)pCVar39;
                    (*pBVar13->_vptr_BaseExpression[1])();
                    _Var30._M_head_impl = local_370._M_head_impl;
                  }
                }
                local_370._M_head_impl = _Var30._M_head_impl;
                this_02 = (PivotRef *)&(pPVar45->super_TableRef).type;
                __n = __n + 1;
              } while (this_02 != (PivotRef *)local_2b8._8_8_);
            }
            pPVar45 = (PivotRef *)&local_2a0->aggregates;
          } while (pPVar45 != local_1c0);
        }
        pCVar2 = local_120;
        puVar3 = (local_310->aggregates).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar49 = (local_310->aggregates).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar49 != puVar3;
            puVar49 = puVar49 + 1) {
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar49);
          (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_360,pPVar20);
          local_208.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_360);
          ExtractPivotAggregateExpression
                    (pCVar2,pPVar21,
                     (vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *)&local_208)
          ;
          pvVar40 = vector<std::reference_wrapper<duckdb::FunctionExpression>,_true>::operator[]
                              ((vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *)
                               &local_208,0);
          pFVar41 = BaseExpression::Cast<duckdb::FunctionExpression>
                              ((BaseExpression *)pvVar40->_M_data);
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)&local_370);
          (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_278,pPVar20);
          uVar14 = local_278.bigint;
          local_278.bigint = 0;
          _Var30._M_head_impl =
               (pFVar41->filter).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pFVar41->filter).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)uVar14;
          if (_Var30._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var30._M_head_impl)->super_BaseExpression + 8))();
          }
          if (local_278._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_278.bigint + 8))();
          }
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar49);
          sVar10 = (local_308->super_TableRef).alias._M_string_length;
          local_278.bigint = (int64_t)(CastExpression *)local_268;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,sVar10,
                     (local_308->super_TableRef).alias.field_2._M_allocated_capacity + sVar10);
          if ((8 < (ulong)((long)(local_310->aggregates).
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_310->aggregates).
                                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) ||
             ((pPVar20->super_BaseExpression).alias._M_string_length != 0)) {
            sVar10 = (pPVar20->super_BaseExpression).alias._M_string_length;
            if (sVar10 == 0) {
              pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar49);
              (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[7])(&local_2f8,pPVar20);
            }
            else {
              local_2f8._M_allocated_capacity = (size_type)&local_2e8;
              pcVar5 = (pPVar20->super_BaseExpression).alias._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2f8,pcVar5,pcVar5 + sVar10);
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_358,"_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f8);
            ::std::__cxx11::string::_M_append(&local_278.tinyint,local_358._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_allocated_capacity != &local_2e8) {
              operator_delete((void *)local_2f8._M_allocated_capacity);
            }
          }
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)&local_360);
          ::std::__cxx11::string::_M_assign((string *)&(pPVar20->super_BaseExpression).alias);
          pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                    operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                *)&local_300);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar26->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_360);
          if (local_278._0_8_ != (CastExpression *)local_268) {
            operator_delete((void *)local_278.bigint);
          }
          if ((StarExpression *)
              local_208.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (StarExpression *)0x0) {
            operator_delete(local_208.
                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((ColumnRefExpression *)local_360._M_head_impl != (ColumnRefExpression *)0x0) {
            (*((BaseExpression *)
              &((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
        }
        if ((CastExpression *)local_370._M_head_impl != (CastExpression *)0x0) {
          (*(((CastExpression *)local_370._M_head_impl)->super_ParsedExpression).
            super_BaseExpression._vptr_BaseExpression[1])();
        }
        local_308 = (PivotRef *)&(local_308->super_TableRef).query_location;
      } while (local_308 != local_1c8);
    }
    _Var30._M_head_impl = local_300._M_head_impl;
    local_300._M_head_impl = (ParsedExpression *)0x0;
    pp_Var55 = ((local_210._M_head_impl)->super_QueryNode)._vptr_QueryNode;
    ((local_210._M_head_impl)->super_QueryNode)._vptr_QueryNode = (_func_int **)_Var30._M_head_impl;
    if (pp_Var55 != (_func_int **)0x0) {
      (**(code **)(*pp_Var55 + 8))();
    }
    if (local_300._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_300._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_300._M_head_impl = (ParsedExpression *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_138);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_158);
  }
  else {
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.index = 0;
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.bigint = 0;
    local_248.hugeint.upper = 0;
    local_258._M_p = (pointer)0x0;
    _Stack_250._M_p = (pointer)0x0;
    local_268 = (undefined1  [8])0x0;
    pbStack_260 = (pointer)0x0;
    local_278.bigint = 0;
    local_278.hugeint.upper = 0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(pPVar45->super_TableRef)._vptr_TableRef;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(pPVar45->super_TableRef).type;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(pPVar45->super_TableRef).alias._M_dataplus._M_p;
    (pPVar45->super_TableRef).alias._M_dataplus._M_p = (pointer)0x0;
    (pPVar45->super_TableRef)._vptr_TableRef = (_func_int **)0x0;
    *(undefined8 *)&(pPVar45->super_TableRef).type = 0;
    local_178.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)local_2b8._M_local_buf,local_310,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_208,(case_insensitive_set_t *)&local_d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_208);
    pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2b8._M_allocated_capacity);
    puVar48 = (pSVar26->select_list).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pSVar26->select_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar48 != puVar1) {
      paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_358 + 0x10);
      local_368 = (PivotRef *)0x0;
      do {
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar48);
        (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[7])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   pPVar20);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (local_268 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._0_8_ != paVar35) {
          operator_delete((void *)local_358._0_8_);
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar48);
        if ((pPVar20->super_BaseExpression).alias._M_string_length == 0) {
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar48);
          local_368 = (PivotRef *)((long)&(local_368->super_TableRef)._vptr_TableRef + 1);
          cVar51 = '\x01';
          if ((PivotRef *)0x9 < local_368) {
            pPVar45 = local_368;
            cVar17 = '\x04';
            do {
              cVar51 = cVar17;
              if (pPVar45 < (PivotRef *)0x64) {
                cVar51 = cVar51 + -2;
                goto LAB_00dfb0dd;
              }
              if (pPVar45 < (PivotRef *)0x3e8) {
                cVar51 = cVar51 + -1;
                goto LAB_00dfb0dd;
              }
              if (pPVar45 < (PivotRef *)0x2710) goto LAB_00dfb0dd;
              bVar18 = (PivotRef *)0x1869f < pPVar45;
              pPVar45 = (PivotRef *)((ulong)pPVar45 / 10000);
              cVar17 = cVar51 + '\x04';
            } while (bVar18);
            cVar51 = cVar51 + '\x01';
          }
LAB_00dfb0dd:
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          ::std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar51);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_2f8._M_allocated_capacity,local_2f8._8_4_,
                     (unsigned_long)local_368);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1dcb623);
          paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar27 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 == paVar44) {
            local_358._16_8_ = paVar44->_M_allocated_capacity;
            local_358._24_8_ = puVar27[3];
            local_358._0_8_ = paVar35;
          }
          else {
            local_358._16_8_ = paVar44->_M_allocated_capacity;
            local_358._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar27;
          }
          local_358._8_8_ = puVar27[1];
          *puVar27 = paVar44;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          ::std::__cxx11::string::operator=
                    ((string *)&(pPVar20->super_BaseExpression).alias,(string *)local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._0_8_ != paVar35) {
            operator_delete((void *)local_358._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity);
          }
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar48);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_278.hugeint,&(pPVar20->super_BaseExpression).alias);
        puVar48 = puVar48 + 1;
      } while (puVar48 != puVar1);
    }
    pPVar45 = (PivotRef *)
              (local_310->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2a0 = (PivotRef *)
                (local_310->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar45 != local_2a0) {
      local_368 = (PivotRef *)0x0;
      do {
        puVar49 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)(pPVar45->super_TableRef)._vptr_TableRef;
        local_308 = *(PivotRef **)&(pPVar45->super_TableRef).type;
        local_2b8._8_8_ = pPVar45;
        if ((PivotRef *)puVar49 != local_308) {
          do {
            pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar49);
            if ((pPVar20->super_BaseExpression).alias._M_string_length == 0) {
              pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar49);
              local_368 = (PivotRef *)((long)&(local_368->super_TableRef)._vptr_TableRef + 1);
              cVar51 = '\x01';
              if ((PivotRef *)0x9 < local_368) {
                pPVar45 = local_368;
                cVar17 = '\x04';
                do {
                  cVar51 = cVar17;
                  if (pPVar45 < (PivotRef *)0x64) {
                    cVar51 = cVar51 + -2;
                    goto LAB_00dfb2d1;
                  }
                  if (pPVar45 < (PivotRef *)0x3e8) {
                    cVar51 = cVar51 + -1;
                    goto LAB_00dfb2d1;
                  }
                  if (pPVar45 < (PivotRef *)0x2710) goto LAB_00dfb2d1;
                  bVar18 = (PivotRef *)0x1869f < pPVar45;
                  pPVar45 = (PivotRef *)((ulong)pPVar45 / 10000);
                  cVar17 = cVar51 + '\x04';
                } while (bVar18);
                cVar51 = cVar51 + '\x01';
              }
LAB_00dfb2d1:
              local_2f8._M_allocated_capacity = (size_type)&local_2e8;
              ::std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar51);
              ::std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_2f8._M_allocated_capacity,local_2f8._8_4_,
                         (unsigned_long)local_368);
              puVar27 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1dcb63a);
              paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar27 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar27 == paVar35) {
                local_358._16_8_ = paVar35->_M_allocated_capacity;
                local_358._24_8_ = puVar27[3];
                local_358._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_358 + 0x10);
              }
              else {
                local_358._16_8_ = paVar35->_M_allocated_capacity;
                local_358._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar27;
              }
              local_358._8_8_ = puVar27[1];
              *puVar27 = paVar35;
              puVar27[1] = 0;
              *(undefined1 *)(puVar27 + 2) = 0;
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar20->super_BaseExpression).alias,(string *)local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_358 + 0x10)) {
                operator_delete((void *)local_358._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_allocated_capacity != &local_2e8) {
                operator_delete((void *)local_2f8._M_allocated_capacity);
              }
            }
            pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar49);
            pcVar5 = (pPVar20->super_BaseExpression).alias._M_dataplus._M_p;
            local_298._M_allocated_capacity = (size_type)&local_288;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,pcVar5,
                       pcVar5 + (pPVar20->super_BaseExpression).alias._M_string_length);
            pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8._M_allocated_capacity);
            pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8._M_allocated_capacity);
            Value::INTEGER((Value *)&local_2f8,
                           (int)((ulong)((long)(pSVar28->select_list).
                                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                               .
                                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pSVar28->select_list).
                                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
            pCVar29 = (ConstantExpression *)operator_new(0x78);
            Value::Value((Value *)local_358,(Value *)&local_2f8);
            ConstantExpression::ConstantExpression(pCVar29,(Value *)local_358);
            Value::~Value((Value *)local_358);
            local_370._M_head_impl = (ParsedExpression *)pCVar29;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&pSVar26->groups,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_370);
            if ((ConstantExpression *)local_370._M_head_impl != (ConstantExpression *)0x0) {
              (*((BaseExpression *)
                &((local_370._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                _vptr_BaseExpression[1])();
            }
            local_370._M_head_impl = (ParsedExpression *)0x0;
            Value::~Value((Value *)&local_2f8);
            pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8._M_allocated_capacity);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&pSVar26->select_list,puVar49);
            _Var30._M_head_impl = (ParsedExpression *)operator_new(0x50);
            local_358._0_8_ = local_358 + 0x10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_allocated_capacity == &local_288) {
              local_358._24_8_ = local_288._8_8_;
            }
            else {
              local_358._0_8_ = local_298._M_allocated_capacity;
            }
            local_358._16_8_ = local_288._M_allocated_capacity;
            local_358._8_8_ = local_298._8_8_;
            local_298._8_8_ = 0;
            local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
            local_298._M_allocated_capacity = (size_type)&local_288;
            ColumnRefExpression::ColumnRefExpression
                      ((ColumnRefExpression *)_Var30._M_head_impl,(string *)local_358);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_);
            }
            _Var6._M_head_impl =
                 (puVar49->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (puVar49->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var30._M_head_impl;
            if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_allocated_capacity != &local_288) {
              operator_delete((void *)local_298._M_allocated_capacity);
            }
            puVar49 = puVar49 + 1;
          } while ((PivotRef *)puVar49 != local_308);
        }
        pPVar45 = (PivotRef *)(local_2b8._8_8_ + 0x70);
      } while (pPVar45 != local_2a0);
    }
    puVar49 = (local_310->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_310->aggregates).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar49 != puVar3) {
      uVar52 = 0;
      do {
        uVar52 = uVar52 + 1;
        cVar51 = '\x01';
        if (9 < uVar52) {
          uVar46 = uVar52;
          cVar17 = '\x04';
          do {
            cVar51 = cVar17;
            if (uVar46 < 100) {
              cVar51 = cVar51 + -2;
              goto LAB_00dfb5d9;
            }
            if (uVar46 < 1000) {
              cVar51 = cVar51 + -1;
              goto LAB_00dfb5d9;
            }
            if (uVar46 < 10000) goto LAB_00dfb5d9;
            bVar18 = 99999 < uVar46;
            uVar46 = uVar46 / 10000;
            cVar17 = cVar51 + '\x04';
          } while (bVar18);
          cVar51 = cVar51 + '\x01';
        }
LAB_00dfb5d9:
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar51);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_2f8._M_allocated_capacity,local_2f8._8_4_,uVar52);
        puVar27 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1dcb64f);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar27 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar27 == paVar35) {
          local_358._16_8_ = paVar35->_M_allocated_capacity;
          local_358._24_8_ = puVar27[3];
          local_358._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_358 + 0x10);
        }
        else {
          local_358._16_8_ = paVar35->_M_allocated_capacity;
          local_358._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar27;
        }
        local_358._8_8_ = puVar27[1];
        *puVar27 = paVar35;
        puVar27[1] = 0;
        *(undefined1 *)(puVar27 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_allocated_capacity != &local_2e8) {
          operator_delete((void *)local_2f8._M_allocated_capacity);
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar49);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248.hugeint,&(pPVar20->super_BaseExpression).alias);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&vStack_230,(value_type *)local_358);
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar49);
        ::std::__cxx11::string::operator=
                  ((string *)&(pPVar20->super_BaseExpression).alias,(string *)local_358);
        pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2b8._M_allocated_capacity);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar26->select_list,puVar49);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_358 + 0x10)) {
          operator_delete((void *)local_358._0_8_);
        }
        puVar49 = puVar49 + 1;
      } while (puVar49 != puVar3);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_178);
    uVar14 = local_2b8._M_allocated_capacity;
    local_2b8._M_allocated_capacity = 0;
    pSVar31 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(pSVar31);
    local_2a8._M_head_impl = (QueryNode *)pSVar31;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
    *(undefined1 *)
     &local_208.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = 1;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )(local_208.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 10);
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )&DAT_00000001;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    *(undefined4 *)
     &local_208.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start[8].
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = 0x3f800000;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[10].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xb].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )(local_208.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 0xd);
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xc].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    *(undefined1 *)
     &local_208.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start[0xd].
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = 0;
    local_2a0 = (PivotRef *)&PTR__SelectStatement_0247e6e8;
    ((local_208.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)&PTR__SelectStatement_0247e6e8;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0xf].
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
    pSVar32 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_208);
    _Var7._M_head_impl =
         (pSVar32->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar32->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar14;
    if (_Var7._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_QueryNode + 8))();
    }
    local_2b8._8_8_ = operator_new(0x70);
    local_2f8._M_allocated_capacity =
         (size_type)
         local_208.
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_358._8_8_ = (element_type *)0x0;
    local_358._16_8_ = local_358._16_8_ & 0xffffffffffffff00;
    local_358._0_8_ = (ColumnRefExpression *)(local_358 + 0x10);
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)local_2b8._8_8_,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&local_2f8._M_allocated_capacity,(string *)local_358);
    if ((ColumnRefExpression *)local_358._0_8_ != (ColumnRefExpression *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_);
    }
    if ((long *)local_2f8._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_allocated_capacity + 8))();
    }
    if (local_278.hugeint.upper != local_278.bigint) {
      sVar50 = 0;
      do {
        pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a8);
        pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a8);
        Value::INTEGER((Value *)&local_2f8,
                       (int)((ulong)((long)(pSVar28->select_list).
                                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           .
                                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar28->select_list).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
        pCVar29 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_358,(Value *)&local_2f8);
        ConstantExpression::ConstantExpression(pCVar29,(Value *)local_358);
        Value::~Value((Value *)local_358);
        local_298._M_allocated_capacity = (size_type)pCVar29;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar26->groups,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_298._M_allocated_capacity);
        if ((ConstantExpression *)local_298._M_allocated_capacity != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_298._M_allocated_capacity + 8))();
        }
        local_298._M_allocated_capacity = 0;
        Value::~Value((Value *)&local_2f8);
        pvVar33 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_278.hugeint,sVar50);
        this_00 = (ColumnRefExpression *)operator_new(0x50);
        local_358._0_8_ = local_358 + 0x10;
        pcVar5 = (pvVar33->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_358,pcVar5,pcVar5 + pvVar33->_M_string_length);
        ColumnRefExpression::ColumnRefExpression(this_00,(string *)local_358);
        local_2f8._M_allocated_capacity = (size_type)this_00;
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_);
        }
        pCVar34 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                *)&local_2f8._M_allocated_capacity);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_278.hugeint,sVar50);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pCVar34->super_ParsedExpression).super_BaseExpression.alias);
        pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a8);
        local_358._0_8_ = local_2f8._M_allocated_capacity;
        local_2f8._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar26->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_358);
        if ((ColumnRefExpression *)local_358._0_8_ != (ColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_358._0_8_ + 8))();
        }
        if ((long *)local_2f8._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_2f8._M_allocated_capacity + 8))();
        }
        sVar50 = sVar50 + 1;
      } while (sVar50 < (ulong)(local_278.hugeint.upper - local_278._0_8_ >> 5));
    }
    if (vStack_230.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        vStack_230.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar50 = 0;
      do {
        pvVar33 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&vStack_230,sVar50);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x50);
        local_358._0_8_ = local_358 + 0x10;
        pcVar5 = (pvVar33->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_358,pcVar5,pcVar5 + pvVar33->_M_string_length);
        ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)paVar35,(string *)local_358)
        ;
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_);
        }
        local_358._0_8_ = (ColumnRefExpression *)0x0;
        local_358._8_8_ = (element_type *)0x0;
        local_358._16_8_ = 0;
        local_2f8._M_allocated_capacity = (size_type)paVar35;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_358,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_2f8._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*local_2f8._M_allocated_capacity + 8))();
        }
        make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_2f8._M_local_buf,(char (*) [5])0x1dd1e0d,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_358);
        pFVar36 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                *)&local_2f8._M_allocated_capacity);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](&vStack_230,sVar50);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pFVar36->super_ParsedExpression).super_BaseExpression.alias);
        pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a8);
        local_298._M_allocated_capacity = local_2f8._M_allocated_capacity;
        local_2f8._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar26->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_298._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*local_298._M_allocated_capacity + 8))();
        }
        if ((long *)local_2f8._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_2f8._M_allocated_capacity + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_358);
        sVar50 = sVar50 + 1;
      } while (sVar50 < (ulong)((long)vStack_230.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vStack_230.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_370._M_head_impl = (ParsedExpression *)0x0;
    pPVar45 = (PivotRef *)
              (local_310->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_308 = (PivotRef *)
                (local_310->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar45 != local_308) {
      do {
        pp_Var8 = *(_func_int ***)&(pPVar45->super_TableRef).type;
        local_368 = pPVar45;
        for (pp_Var55 = (pPVar45->super_TableRef)._vptr_TableRef; pp_Var55 != pp_Var8;
            pp_Var55 = pp_Var55 + 1) {
          local_300._M_head_impl = (ParsedExpression *)*pp_Var55;
          *pp_Var55 = (_func_int *)0x0;
          ConstructPivotExpression
                    ((duckdb *)&local_360,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_300);
          if (local_300._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_300._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          _Var30._M_head_impl = local_360._M_head_impl;
          local_300._M_head_impl = (ParsedExpression *)0x0;
          if ((ColumnRefExpression *)local_370._M_head_impl == (ColumnRefExpression *)0x0) {
            local_360._M_head_impl = (ParsedExpression *)0x0;
            local_370._M_head_impl = _Var30._M_head_impl;
          }
          else {
            local_298._M_allocated_capacity = 0;
            local_298._8_8_ = 0;
            local_288._M_allocated_capacity = 0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_370);
            Value::Value((Value *)&local_2f8,"_");
            pCVar29 = (ConstantExpression *)operator_new(0x78);
            Value::Value((Value *)local_358,(Value *)&local_2f8);
            ConstantExpression::ConstantExpression(pCVar29,(Value *)local_358);
            Value::~Value((Value *)local_358);
            local_1f0._M_nxt = (_Hash_node_base *)pCVar29;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_1f0);
            if ((ConstantExpression *)local_1f0._M_nxt != (ConstantExpression *)0x0) {
              (*(((ParsedExpression *)&(local_1f0._M_nxt)->_M_nxt)->super_BaseExpression).
                _vptr_BaseExpression[1])();
            }
            local_1f0._M_nxt = (_Hash_node_base *)0x0;
            Value::~Value((Value *)&local_2f8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_360);
            make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                      ((duckdb *)local_358,(char (*) [7])0x1f16225,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&local_298);
            uVar14 = local_358._0_8_;
            _Var30._M_head_impl = local_370._M_head_impl;
            local_358._0_8_ = (ColumnRefExpression *)0x0;
            local_370._M_head_impl = (ParsedExpression *)uVar14;
            if ((ColumnRefExpression *)_Var30._M_head_impl != (ColumnRefExpression *)0x0) {
              (*((BaseExpression *)
                &((_Var30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                _vptr_BaseExpression[1])();
            }
            if ((ColumnRefExpression *)local_358._0_8_ != (ColumnRefExpression *)0x0) {
              (**(code **)(*(long *)local_358._0_8_ + 8))();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&local_298);
          }
          if ((ColumnRefExpression *)local_360._M_head_impl != (ColumnRefExpression *)0x0) {
            (*((BaseExpression *)
              &((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
        }
        pPVar45 = (PivotRef *)&local_368->aggregates;
      } while (pPVar45 != local_308);
    }
    local_2f8._M_allocated_capacity = 0;
    local_2f8._8_8_ = (undefined1 *)0x0;
    local_2e8._M_allocated_capacity = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_2f8._M_local_buf,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_370);
    make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_360,(char (*) [5])0x1dd1e0d,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_2f8);
    pFVar36 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_360);
    local_298._M_allocated_capacity = 0x15;
    local_358._0_8_ = local_358 + 0x10;
    local_358._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_358,(ulong)&local_298);
    local_358._16_8_ = local_298._M_allocated_capacity;
    builtin_strncpy((char *)local_358._0_8_,"__internal_pivot_name",0x15);
    local_358._8_8_ = local_298._M_allocated_capacity;
    *(char *)(local_358._0_8_ + local_298._M_allocated_capacity) = '\0';
    ::std::__cxx11::string::operator=
              ((string *)&(pFVar36->super_ParsedExpression).super_BaseExpression.alias,
               (string *)local_358);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_);
    }
    pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2a8);
    local_358._0_8_ = local_360._M_head_impl;
    local_360._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar26->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_358);
    if ((ColumnRefExpression *)local_358._0_8_ != (ColumnRefExpression *)0x0) {
      (**(code **)(*(long *)local_358._0_8_ + 8))();
    }
    pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2a8);
    _Var37._M_head_impl =
         (pSVar26->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar26->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)local_2b8._8_8_;
    if (_Var37._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var37._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((ColumnRefExpression *)local_360._M_head_impl != (ColumnRefExpression *)0x0) {
      (*((BaseExpression *)&((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_2f8);
    if ((ColumnRefExpression *)local_370._M_head_impl != (ColumnRefExpression *)0x0) {
      (*((BaseExpression *)&((local_370._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    if (local_208.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((local_208.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    _Var15._M_head_impl = local_2a8._M_head_impl;
    local_2a8._M_head_impl = (QueryNode *)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar31 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(pSVar31);
    local_370._M_head_impl = (ParsedExpression *)pSVar31;
    local_298._M_allocated_capacity = (size_type)operator_new(0x80);
    *(undefined1 *)(local_298._M_allocated_capacity + 8) = 1;
    *(long *)(local_298._M_allocated_capacity + 0x10) = 0;
    *(long *)(local_298._M_allocated_capacity + 0x18) = 0;
    *(long **)(local_298._M_allocated_capacity + 0x20) =
         (long *)(local_298._M_allocated_capacity + 0x50);
    *(long *)(local_298._M_allocated_capacity + 0x28) = 1;
    *(long *)(local_298._M_allocated_capacity + 0x30) = 0;
    *(long *)(local_298._M_allocated_capacity + 0x38) = 0;
    *(undefined4 *)(local_298._M_allocated_capacity + 0x40) = 0x3f800000;
    *(long *)(local_298._M_allocated_capacity + 0x48) = 0;
    *(long *)(local_298._M_allocated_capacity + 0x50) = 0;
    *(long **)(local_298._M_allocated_capacity + 0x58) =
         (long *)(local_298._M_allocated_capacity + 0x68);
    *(long *)(local_298._M_allocated_capacity + 0x60) = 0;
    *(undefined1 *)(local_298._M_allocated_capacity + 0x68) = 0;
    *(PivotRef **)local_298._M_allocated_capacity = local_2a0;
    *(long *)(local_298._M_allocated_capacity + 0x78) = 0;
    pSVar32 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_298._M_allocated_capacity);
    _Var7._M_head_impl =
         (pSVar32->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar32->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var15._M_head_impl;
    if (_Var7._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_QueryNode + 8))();
    }
    _Var37._M_head_impl = (TableRef *)operator_new(0x70);
    local_2f8._M_allocated_capacity = local_298._M_allocated_capacity;
    local_298._M_allocated_capacity = 0;
    local_358._8_8_ = (element_type *)0x0;
    local_358._16_8_ = local_358._16_8_ & 0xffffffffffffff00;
    local_358._0_8_ = local_358 + 0x10;
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)_Var37._M_head_impl,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&local_2f8._M_allocated_capacity,(string *)local_358);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_);
    }
    if ((long *)local_2f8._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_2f8._M_allocated_capacity + 8))();
    }
    local_2f8._M_allocated_capacity = (size_type)operator_new(0x120);
    ((TableRef *)local_2f8._M_allocated_capacity)->type = PIVOT;
    (((TableRef *)local_2f8._M_allocated_capacity)->alias)._M_dataplus._M_p =
         (pointer)&(((TableRef *)local_2f8._M_allocated_capacity)->alias).field_2;
    (((TableRef *)local_2f8._M_allocated_capacity)->alias)._M_string_length = 0;
    (((TableRef *)local_2f8._M_allocated_capacity)->alias).field_2._M_local_buf[0] = '\0';
    (((TableRef *)local_2f8._M_allocated_capacity)->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t =
         (tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    (((TableRef *)local_2f8._M_allocated_capacity)->query_location).index = 0xffffffffffffffff;
    (((TableRef *)local_2f8._M_allocated_capacity)->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((TableRef *)local_2f8._M_allocated_capacity)->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TableRef *)local_2f8._M_allocated_capacity)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
    (((TableRef *)local_2f8._M_allocated_capacity)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((TableRef *)local_2f8._M_allocated_capacity)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((TableRef *)local_2f8._M_allocated_capacity)->_vptr_TableRef =
         (_func_int **)&PTR__PivotRef_0247edc0;
    ((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->_vptr_TableRef = (_func_int **)0x0;
    *(undefined8 *)&((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->type = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->alias)._M_dataplus._M_p = (pointer)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->alias)._M_string_length = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->alias).field_2._M_allocated_capacity =
         0;
    *(undefined8 *)
     ((long)&(((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->alias).field_2 + 8) = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t =
         (tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->query_location).index = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->column_name_alias).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(((TableRef *)(local_2f8._M_allocated_capacity + 0x68))->column_name_alias).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->query_location).index = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    *(undefined8 *)
     ((long)&(((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->alias).field_2 + 8) = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t =
         (tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->alias)._M_string_length = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->alias).field_2._M_allocated_capacity =
         0;
    *(undefined8 *)&((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->type = 0;
    (((TableRef *)(local_2f8._M_allocated_capacity + 0xd0))->alias)._M_dataplus._M_p = (pointer)0x0;
    pPVar38 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_2f8._M_allocated_capacity);
    local_358._0_8_ =
         (pPVar38->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_358._8_8_ =
         (pPVar38->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_358._16_8_ =
         (pPVar38->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar38->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pPVar38->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pPVar38->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              ((vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> *)
               local_358);
    pPVar38 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_2f8._M_allocated_capacity);
    local_358._0_8_ =
         (pPVar38->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_358._8_8_ =
         (pPVar38->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_358._16_8_ =
         (pPVar38->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar38->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbStack_260;
    (pPVar38->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_p;
    (pPVar38->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Stack_250._M_p;
    pbStack_260 = (pointer)0x0;
    local_258._M_p = (pointer)0x0;
    _Stack_250._M_p = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_358);
    pPVar38 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_2f8._M_allocated_capacity);
    local_358._0_8_ =
         (pPVar38->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_358._8_8_ =
         (pPVar38->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_358._16_8_ =
         (pPVar38->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar38->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_248.bigint;
    (pPVar38->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_248.hugeint.upper;
    (pPVar38->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238.index;
    local_248.bigint = 0;
    local_248.hugeint.upper = 0;
    local_238.index = 0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_358);
    pPVar38 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_2f8._M_allocated_capacity);
    _Var9._M_head_impl =
         (pPVar38->source).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pPVar38->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var37._M_head_impl;
    if (_Var9._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var9._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_370);
    this_01 = (StarExpression *)operator_new(0x110);
    local_358._8_8_ = (element_type *)0x0;
    local_358._16_8_ = local_358._16_8_ & 0xffffffffffffff00;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_358 + 0x10);
    StarExpression::StarExpression(this_01,(string *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_);
    }
    local_208.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar26->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_208);
    if ((StarExpression *)
        local_208.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (StarExpression *)0x0) {
      (*(((ParsedExpression *)
         &(local_208.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         )->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    uVar14 = local_2f8._M_allocated_capacity;
    local_2f8._M_allocated_capacity = 0;
    pSVar26 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_370);
    _Var37._M_head_impl =
         (pSVar26->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar26->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar14;
    if (_Var37._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var37._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_2f8._M_allocated_capacity + 8))();
    }
    if ((_func_int **)local_298._M_allocated_capacity != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_298._M_allocated_capacity + 8))();
    }
    _Var30._M_head_impl = local_370._M_head_impl;
    local_370._M_head_impl = (ParsedExpression *)0x0;
    pp_Var55 = ((local_210._M_head_impl)->super_QueryNode)._vptr_QueryNode;
    ((local_210._M_head_impl)->super_QueryNode)._vptr_QueryNode = (_func_int **)_Var30._M_head_impl;
    if (pp_Var55 != (_func_int **)0x0) {
      (**(code **)(*pp_Var55 + 8))();
    }
    if (local_370._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_370._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_370._M_head_impl = (ParsedExpression *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_198);
    if (local_2a8._M_head_impl != (QueryNode *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_QueryNode[1])();
    }
    if ((QueryNode *)local_2b8._M_allocated_capacity != (QueryNode *)0x0) {
      (**(code **)(*(long *)local_2b8._M_allocated_capacity + 8))();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vStack_230);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248.hugeint);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_268 + 8));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_278.hugeint);
  }
  ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
            (&local_1e8);
  if (local_1b8.
      super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d8);
  return (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)
         (__uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)
         local_210._M_head_impl;
}

Assistant:

unique_ptr<SelectNode> Binder::BindPivot(PivotRef &ref, vector<unique_ptr<ParsedExpression>> all_columns) {
	// keep track of the columns by which we pivot/aggregate
	// any columns which are not pivoted/aggregated on are added to the GROUP BY clause
	case_insensitive_set_t handled_columns;

	vector<reference<FunctionExpression>> pivot_aggregates;
	// parse the aggregate, and extract the referenced columns from the aggregate
	for (auto &aggr : ref.aggregates) {
		if (aggr->HasSubquery()) {
			throw BinderException(*aggr, "Pivot expression cannot contain subqueries");
		}
		if (aggr->IsWindow()) {
			throw BinderException(*aggr, "Pivot expression cannot contain window functions");
		}
		idx_t aggregate_count = pivot_aggregates.size();
		ExtractPivotAggregateExpression(context, *aggr, pivot_aggregates);
		if (pivot_aggregates.size() != aggregate_count + 1) {
			string error_str = pivot_aggregates.size() == aggregate_count
			                       ? "but no aggregates were found"
			                       : "but " + to_string(pivot_aggregates.size() - aggregate_count) + " were found";
			throw BinderException(*aggr, "Pivot expression must contain exactly one aggregate, %s", error_str);
		}
	}
	for (auto &aggr : pivot_aggregates) {
		ExtractPivotExpressions(aggr.get(), handled_columns);
	}

	// first add all pivots to the set of handled columns, and check for duplicates
	idx_t total_pivots = 1;
	for (auto &pivot : ref.pivots) {
		if (!pivot.pivot_enum.empty()) {
			auto &type_entry =
			    Catalog::GetEntry<TypeCatalogEntry>(context, INVALID_CATALOG, INVALID_SCHEMA, pivot.pivot_enum);
			auto type = type_entry.user_type;
			if (type.id() != LogicalTypeId::ENUM) {
				throw BinderException(ref, "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"",
				                      pivot.pivot_enum, type.ToString());
			}
			if (!type.IsComplete()) {
				throw BinderException("ENUM type is incomplete");
			}
			auto enum_size = EnumType::GetSize(type);
			for (idx_t i = 0; i < enum_size; i++) {
				auto enum_value = EnumType::GetValue(Value::ENUM(i, type));
				PivotColumnEntry entry;
				entry.values.emplace_back(enum_value);
				entry.alias = std::move(enum_value);
				pivot.entries.push_back(std::move(entry));
			}
		}
		total_pivots *= pivot.entries.size();
		// add the pivoted column to the columns that have been handled
		for (auto &pivot_name : pivot.pivot_expressions) {
			ExtractPivotExpressions(*pivot_name, handled_columns);
		}
		value_set_t pivots;
		for (auto &entry : pivot.entries) {
			D_ASSERT(!entry.expr);
			Value val;
			if (entry.values.size() == 1) {
				val = entry.values[0];
			} else {
				val = Value::LIST(LogicalType::VARCHAR, entry.values);
			}
			if (pivots.find(val) != pivots.end()) {
				throw BinderException(ref, "The value \"%s\" was specified multiple times in the IN clause",
				                      val.ToString());
			}
			if (entry.values.size() != pivot.pivot_expressions.size()) {
				throw BinderException(ref, "PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
				                      pivot.pivot_expressions.size(), entry.values.size());
			}
			pivots.insert(val);
		}
	}
	auto &client_config = ClientConfig::GetConfig(context);
	auto pivot_limit = client_config.pivot_limit;
	if (total_pivots >= pivot_limit) {
		throw BinderException(ref, "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
		                      client_config.pivot_limit);
	}

	// construct the required pivot values recursively
	vector<PivotValueElement> pivot_values;
	ConstructPivots(ref, pivot_values);

	unique_ptr<SelectNode> pivot_node;
	// pivots have three components
	// - the pivots (i.e. future column names)
	// - the groups (i.e. the future row names
	// - the aggregates (i.e. the values of the pivot columns)

	// we have two ways of executing a pivot statement
	// (1) the straightforward manner of filtered aggregates SUM(..) FILTER (pivot_value=X)
	// (2) computing the aggregates once, then using LIST to group the aggregates together with the PIVOT operator
	// -> filtered aggregates are faster when there are FEW pivot values
	// -> LIST is faster when there are MANY pivot values
	// we switch dynamically based on the number of pivots to compute
	if (pivot_values.size() <= client_config.pivot_filter_threshold) {
		// use a set of filtered aggregates
		pivot_node =
		    PivotFilteredAggregate(context, ref, std::move(all_columns), handled_columns, std::move(pivot_values));
	} else {
		// executing a pivot statement happens in three stages
		// 1) execute the query "SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		// this computes all values that are required in the final result, but not yet in the correct orientation
		// 2) execute the query "SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		// this pushes all pivots and aggregates that belong to a specific group together in an aligned manner
		// 3) push a PIVOT operator, that performs the actual pivoting of the values into the different columns

		PivotBindState bind_state;
		// Pivot Stage 1
		// SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		auto subquery_stage1 = PivotInitialAggregate(bind_state, ref, std::move(all_columns), handled_columns);

		// Pivot stage 2
		// SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		auto subquery_stage2 = PivotListAggregate(bind_state, ref, std::move(subquery_stage1));

		// Pivot stage 3
		// construct the final pivot operator
		pivot_node = PivotFinalOperator(bind_state, ref, std::move(subquery_stage2), std::move(pivot_values));
	}
	return pivot_node;
}